

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O0

void insertions(BamReader *br,RefVector *ref,int bpRegion,
               vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersUp,
               vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersDown,string *folderPath)

{
  undefined1 st_00 [4];
  int refID;
  bool bVar1;
  int iVar2;
  reference pSVar3;
  size_type sVar4;
  const_reference pvVar5;
  size_type sVar6;
  const_reference refName;
  int en;
  int st;
  int curSup;
  int i;
  int bestSup;
  int bestIdx;
  undefined1 local_e0 [4];
  int stBound;
  SoftCluster scUp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SoftCluster,_std::allocator<SoftCluster>_> *__range1;
  string *folderPath_local;
  vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersDown_local;
  vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersUp_local;
  int bpRegion_local;
  RefVector *ref_local;
  BamReader *br_local;
  
  __end1 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::begin(scClustersUp);
  scUp.nodes.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage =
       (pointer)std::vector<SoftCluster,_std::allocator<SoftCluster>_>::end(scClustersUp);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_SoftCluster_*,_std::vector<SoftCluster,_std::allocator<SoftCluster>_>_>
                                     *)&scUp.nodes.
                                        super__Vector_base<SoftNode,_std::allocator<SoftNode>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage), bVar1) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<const_SoftCluster_*,_std::vector<SoftCluster,_std::allocator<SoftCluster>_>_>
             ::operator*(&__end1);
    SoftCluster::SoftCluster((SoftCluster *)local_e0,pSVar3);
    st = getIdx((int)local_e0 + -0x1e,scClustersDown);
    if (st != -1) {
      i = -1;
      curSup = 0;
      while ((sVar4 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::size(scClustersDown),
             (ulong)(long)st < sVar4 &&
             (pvVar5 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at
                                 (scClustersDown,(long)st),
             (pvVar5->info).scPos - (int)local_e0 < 0x1f))) {
        pvVar5 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at(scClustersDown,(long)st)
        ;
        if (-0x1f < (pvVar5->info).scPos - (int)local_e0) {
          sVar4 = std::vector<SoftNode,_std::allocator<SoftNode>_>::size
                            ((vector<SoftNode,_std::allocator<SoftNode>_> *)&scUp.info.scAtRight);
          pvVar5 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at
                             (scClustersDown,(long)st);
          sVar6 = std::vector<SoftNode,_std::allocator<SoftNode>_>::size(&pvVar5->nodes);
          iVar2 = (int)sVar4 + (int)sVar6;
          if (curSup < iVar2) {
            i = st;
            curSup = iVar2;
          }
        }
        st = st + 1;
      }
      st_00 = local_e0;
      if (i != -1) {
        pvVar5 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at(scClustersDown,(long)i);
        refID = scUp.info.start;
        iVar2 = (pvVar5->info).scPos;
        refName = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                            (ref,(long)scUp.info.start);
        writeReads(br,ref,refID,&refName->RefName,(int)st_00,iVar2,bpRegion,folderPath);
      }
    }
    SoftCluster::~SoftCluster((SoftCluster *)local_e0);
    __gnu_cxx::
    __normal_iterator<const_SoftCluster_*,_std::vector<SoftCluster,_std::allocator<SoftCluster>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void insertions(BamTools::BamReader &br, const BamTools::RefVector &ref, const int bpRegion, const std::vector<SoftCluster> &scClustersUp, const std::vector<SoftCluster> &scClustersDown, const std::string &folderPath)
{
	for (SoftCluster scUp : scClustersUp)
	{
		int stBound = getIdx(scUp.info.scPos + MIN_INS_DIFF_CLUSTERS, scClustersDown);
		if (stBound == -1)
			continue;

		int bestIdx = -1, bestSup = 0;
		for (int i = stBound; i < scClustersDown.size(); ++i)
		{
			if (scClustersDown.at(i).info.scPos - scUp.info.scPos > MAX_INS_DIFF_CLUSTERS)
				break;
			if (scClustersDown.at(i).info.scPos - scUp.info.scPos < MIN_INS_DIFF_CLUSTERS)
				continue;
			int curSup = scUp.nodes.size() + scClustersDown.at(i).nodes.size();
			if (curSup > bestSup)
			{
				bestSup = curSup;
				bestIdx = i;
			}
		}
		if (bestIdx != -1)
		{
			int st = scUp.info.scPos;
			int en = scClustersDown.at(bestIdx).info.scPos;
			writeReads(br, ref, scUp.info.refID, ref.at(scUp.info.refID).RefName, st, en, bpRegion, folderPath);
		}
	}
}